

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_count_quantity.cpp
# Opt level: O0

void __thiscall
polyscope::SurfaceFaceCountQuantity::SurfaceFaceCountQuantity
          (SurfaceFaceCountQuantity *this,string *name,
          vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
          *values_,SurfaceMesh *mesh_)

{
  int iVar1;
  long lVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  bool bVar5;
  size_type sVar6;
  reference ppVar7;
  size_t sVar8;
  mapped_type_conflict *pmVar9;
  reference pvVar10;
  reference v;
  string *in_RSI;
  undefined8 *in_RDI;
  undefined8 uVar12;
  undefined1 auVar11 [64];
  pair<glm::vec<3,_float,_(glm::qualifier)0>,_int> pVar13;
  size_t j;
  vec3 faceCenter;
  size_t D;
  value_type *face;
  size_t iF;
  pair<unsigned_long,_int> *t_1;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_> *__range1;
  size_t iP;
  vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_> newValues;
  pair<unsigned_long,_int> *t;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_> *__range2;
  map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
  m;
  value_type *in_stack_fffffffffffffdf8;
  __normal_iterator<std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>
  *in_stack_fffffffffffffe00;
  vec<3,_float,_(glm::qualifier)0> *__x;
  unsigned_long *in_stack_fffffffffffffe08;
  vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
  *in_stack_fffffffffffffe10;
  key_type_conflict *in_stack_fffffffffffffe38;
  iterator in_stack_fffffffffffffe40;
  SurfaceCountQuantity *in_stack_fffffffffffffe90;
  vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
  *in_stack_fffffffffffffe98;
  vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
  *in_stack_fffffffffffffea0;
  ulong local_148;
  vec<3,float,(glm::qualifier)0> local_13c [12];
  size_type local_130;
  reference local_128;
  size_type local_120;
  reference local_118;
  pair<unsigned_long,_int> *local_110;
  __normal_iterator<std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>
  local_108 [2];
  _Self local_f8;
  _Self local_f0;
  ulong local_e8;
  string *in_stack_ffffffffffffff38;
  SurfaceMesh *in_stack_ffffffffffffff40;
  __normal_iterator<std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>
  in_stack_ffffffffffffff48;
  SurfaceCountQuantity *in_stack_ffffffffffffff50;
  allocator local_61;
  string local_60 [32];
  string local_40 [64];
  
  std::__cxx11::string::string(local_40,in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"face count",&local_61);
  SurfaceCountQuantity::SurfaceCountQuantity
            (in_stack_ffffffffffffff50,(string *)in_stack_ffffffffffffff48._M_current,
             in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::~string(local_40);
  *in_RDI = &PTR__SurfaceFaceCountQuantity_00795e78;
  std::
  map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
  ::map((map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
         *)0x3c8b21);
  sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI[1] + 0x240));
  if (sVar6 != 0) {
    std::
    map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
    ::map((map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
           *)0x3c8b50);
    std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>::
    begin((vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_> *)
          in_stack_fffffffffffffdf8);
    std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>::end
              ((vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                *)in_stack_fffffffffffffdf8);
    while (bVar5 = __gnu_cxx::operator!=
                             (in_stack_fffffffffffffe00,
                              (__normal_iterator<std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>
                               *)in_stack_fffffffffffffdf8), bVar5) {
      ppVar7 = __gnu_cxx::
               __normal_iterator<std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>
               ::operator*((__normal_iterator<std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>
                            *)&stack0xffffffffffffff48);
      iVar1 = ppVar7->second;
      pmVar9 = std::
               map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
               ::operator[]((map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
                             *)in_stack_fffffffffffffe40._M_node,in_stack_fffffffffffffe38);
      *pmVar9 = iVar1;
      __gnu_cxx::
      __normal_iterator<std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>
      ::operator++((__normal_iterator<std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>
                    *)&stack0xffffffffffffff48);
    }
    std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>::
    vector((vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_> *
           )0x3c8c73);
    for (local_e8 = 0; uVar4 = local_e8, sVar8 = SurfaceMesh::nFaces((SurfaceMesh *)0x3c8c9d),
        uVar4 < sVar8; local_e8 = local_e8 + 1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI[1] + 0x240),
                 local_e8);
      in_stack_fffffffffffffe40 =
           std::
           map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
           ::find((map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
                   *)in_stack_fffffffffffffdf8,(key_type_conflict *)0x3c8ce7);
      local_f0._M_node = in_stack_fffffffffffffe40._M_node;
      local_f8._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
           ::end((map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
                  *)in_stack_fffffffffffffdf8);
      bVar5 = std::operator!=(&local_f0,&local_f8);
      if (bVar5) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI[1] + 0x240),
                   local_e8);
        in_stack_fffffffffffffe38 =
             (key_type_conflict *)
             std::
             map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
             ::operator[]((map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
                           *)in_stack_fffffffffffffe40._M_node,in_stack_fffffffffffffe38);
        std::vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>>::
        emplace_back<unsigned_long&,int&>
                  (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                   (int *)in_stack_fffffffffffffe00);
      }
    }
    std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>::
    operator=(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>::
    ~vector(in_stack_fffffffffffffe10);
    std::
    map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
    ::~map((map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
            *)0x3c8dec);
  }
  local_108[0]._M_current =
       (pair<unsigned_long,_int> *)
       std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>::
       begin((vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
              *)in_stack_fffffffffffffdf8);
  local_110 = (pair<unsigned_long,_int> *)
              std::
              vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
              ::end((vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                     *)in_stack_fffffffffffffdf8);
  pVar13._8_8_ = in_stack_fffffffffffffe00;
  pVar13.first._0_8_ = in_stack_fffffffffffffe08;
  while (bVar5 = __gnu_cxx::operator!=
                           (pVar13._8_8_,
                            (__normal_iterator<std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>
                             *)in_stack_fffffffffffffdf8), bVar5) {
    local_118 = __gnu_cxx::
                __normal_iterator<std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>
                ::operator*(local_108);
    iVar1 = local_118->second;
    pmVar9 = std::
             map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
             ::operator[]((map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
                           *)in_stack_fffffffffffffe40._M_node,in_stack_fffffffffffffe38);
    *pmVar9 = iVar1;
    local_120 = local_118->first;
    local_128 = std::
                vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              *)(in_RDI[1] + 0x2e0),local_120);
    local_130 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_128);
    auVar11 = ZEXT1664((undefined1  [16])0x0);
    glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>(local_13c,0.0,0.0,0.0);
    for (local_148 = 0; __x = pVar13._8_8_, local_148 < local_130; local_148 = local_148 + 1) {
      lVar2 = in_RDI[1];
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (local_128,local_148);
      v = std::
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          ::operator[]((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                        *)(lVar2 + 0x2c8),*pvVar10);
      glm::vec<3,float,(glm::qualifier)0>::operator+=(local_13c,v);
    }
    auVar3 = vcvtusi2sd_avx512f(auVar11._0_16_,local_130);
    uVar12 = auVar3._8_8_;
    glm::vec<3,float,(glm::qualifier)0>::operator/=(local_13c,auVar3._0_8_);
    in_stack_fffffffffffffdf8 = (value_type *)(in_RDI + 0x10);
    pVar13 = std::make_pair<glm::vec<3,float,(glm::qualifier)0>&,int&>
                       (__x,(int *)in_stack_fffffffffffffdf8);
    auVar3._8_8_ = uVar12;
    auVar3._0_8_ = pVar13.first._0_8_;
    in_stack_fffffffffffffe90 = (SurfaceCountQuantity *)vmovlpd_avx(auVar3);
    std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>::
    pair<glm::vec<3,_float,_(glm::qualifier)0>,_int,_true>
              ((pair<glm::vec<3,_float,_(glm::qualifier)0>,_double> *)&stack0xfffffffffffffea0,
               (pair<glm::vec<3,_float,_(glm::qualifier)0>,_int> *)&stack0xfffffffffffffe90);
    std::
    vector<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>,_std::allocator<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>_>_>
    ::push_back(pVar13._8_8_,in_stack_fffffffffffffdf8);
    __gnu_cxx::
    __normal_iterator<std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>
    ::operator++(local_108);
  }
  SurfaceCountQuantity::initializeLimits(in_stack_fffffffffffffe90);
  return;
}

Assistant:

SurfaceFaceCountQuantity::SurfaceFaceCountQuantity(std::string name, std::vector<std::pair<size_t, int>> values_,
                                                   SurfaceMesh& mesh_)
    : SurfaceCountQuantity(name, mesh_, "face count") {

  // Apply permutation if needed
  if (parent.facePerm.size() > 0) {

    // Build a temporary map to invert
    std::map<size_t, int> m;
    for (auto& t : values_) {
      m[t.first] = t.second;
    }

    // Invert
    std::vector<std::pair<size_t, int>> newValues;
    for (size_t iP = 0; iP < parent.nFaces(); iP++) {
      if (m.find(parent.facePerm[iP]) != m.end()) {
        newValues.emplace_back(iP, m[parent.facePerm[iP]]);
      }
    }

    values_ = newValues;
  }

  for (auto& t : values_) {
    values[t.first] = t.second;

    size_t iF = t.first;
    auto& face = parent.faces[iF];
    size_t D = face.size();
    glm::vec3 faceCenter = glm::vec3{0., 0., 0.};
    for (size_t j = 0; j < D; j++) {
      faceCenter += parent.vertices[face[j]];
    }
    faceCenter /= static_cast<double>(D);

    entries.push_back(std::make_pair(faceCenter, t.second));
  }

  initializeLimits();
}